

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O2

void __thiscall Dinic::addEdge(Dinic *this,int a,int b,Flow cap)

{
  Edge local_50;
  vector<Edge,_std::allocator<Edge>_> *local_38;
  
  local_50.flow = 0;
  local_38 = &this->e;
  local_50.a = a;
  local_50.b = b;
  local_50.cap = cap;
  std::vector<Edge,_std::allocator<Edge>_>::emplace_back<Edge>(local_38,&local_50);
  local_50.flow =
       CONCAT44(local_50.flow._4_4_,
                (int)(((long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x18) + -1);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((this->g).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + a,(int *)&local_50);
  local_50.flow = 0;
  local_50.cap = 0;
  local_50.a = b;
  local_50.b = a;
  std::vector<Edge,_std::allocator<Edge>_>::emplace_back<Edge>(local_38,&local_50);
  local_50.flow =
       CONCAT44(local_50.flow._4_4_,
                (int)(((long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x18) + -1);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((this->g).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + b,(int *)&local_50);
  return;
}

Assistant:

void addEdge(int a, int b, Flow cap) {
        e.push_back(Edge(a, b, cap));
        g[a].push_back(e.size() - 1);
        e.push_back(Edge(b, a, 0));
        g[b].push_back(e.size() - 1);
    }